

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O0

void work_lda_exc_unpol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  double my_rho [2];
  double dens;
  size_t ip;
  xc_lda_out_params *in_stack_00000268;
  double *in_stack_00000270;
  size_t in_stack_00000278;
  xc_func_type *in_stack_00000280;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  double local_30;
  ulong local_28;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_48,0,0x10);
  for (local_28 = 0; local_28 < local_10; local_28 = local_28 + 1) {
    if (*(int *)(local_8 + 8) == 2) {
      local_50 = *(double *)(local_18 + local_28 * (long)*(int *)(local_8 + 0x48) * 8) +
                 *(double *)(local_18 + 8 + local_28 * (long)*(int *)(local_8 + 0x48) * 8);
    }
    else {
      local_50 = *(double *)(local_18 + local_28 * (long)*(int *)(local_8 + 0x48) * 8);
    }
    local_30 = local_50;
    if (*(double *)(local_8 + 0x180) <= local_50) {
      if (*(double *)(local_18 + local_28 * (long)*(int *)(local_8 + 0x48) * 8) <=
          *(double *)(local_8 + 0x180)) {
        local_58 = *(undefined8 *)(local_8 + 0x180);
      }
      else {
        local_58 = *(undefined8 *)(local_18 + local_28 * (long)*(int *)(local_8 + 0x48) * 8);
      }
      local_48 = local_58;
      if (*(int *)(local_8 + 8) == 2) {
        if (*(double *)(local_18 + 8 + local_28 * (long)*(int *)(local_8 + 0x48) * 8) <=
            *(double *)(local_8 + 0x180)) {
          local_60 = *(undefined8 *)(local_8 + 0x180);
        }
        else {
          local_60 = *(undefined8 *)(local_18 + 8 + local_28 * (long)*(int *)(local_8 + 0x48) * 8);
        }
        local_40 = local_60;
      }
      func_exc_unpol(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
    }
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}